

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::snedecor_f_dist<double>::cdf(snedecor_f_dist<double> *this,result_type_conflict2 x)

{
  char *in_RCX;
  int extraout_EDX;
  void *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar1;
  double unaff_retaddr;
  result_type_conflict2 m;
  result_type_conflict2 n;
  param_type *p;
  
  p = in_RDI;
  param_type::n(in_RDI);
  param_type::m(in_RDI,in_RSI,extraout_EDX,in_RCX,in_R8D,in_R9D);
  dVar1 = math::Beta_I(unaff_retaddr,(double)p,in_XMM0_Qa);
  return dVar1;
}

Assistant:

cdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      return math::Beta_I(n * x / (m + n * x), result_type(1) / result_type(2) * n,
                          result_type(1) / result_type(2) * m);
    }